

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constant_filter.cpp
# Opt level: O3

FilterPropagateResult __thiscall
duckdb::ConstantFilter::CheckStatistics(ConstantFilter *this,BaseStatistics *stats)

{
  PhysicalType PVar1;
  bool bVar2;
  FilterPropagateResult FVar3;
  ExpressionType comparison_type;
  idx_t in_R8;
  array_ptr<duckdb::Value,_true> constants;
  array_ptr<duckdb::Value,_true> constants_00;
  
  bVar2 = BaseStatistics::CanHaveNoNull(stats);
  if (!bVar2) {
    return FILTER_ALWAYS_FALSE;
  }
  comparison_type = (char)this + OPERATOR_UNPACK;
  PVar1 = (this->constant).type_.physical_type_;
  if (((PVar1 < 0xd) && ((0x1bfcU >> (PVar1 & 0x1f) & 1) != 0)) || (PVar1 - 0xcb < 2)) {
    constants.count = in_R8;
    constants.ptr = (Value *)&DAT_00000001;
    FVar3 = NumericStats::CheckZonemap
                      ((NumericStats *)stats,
                       (BaseStatistics *)(ulong)(byte)(this->super_TableFilter).field_0x9,
                       comparison_type,constants);
  }
  else {
    if (PVar1 != VARCHAR) {
      return NO_PRUNING_POSSIBLE;
    }
    constants_00.count = in_R8;
    constants_00.ptr = (Value *)&DAT_00000001;
    FVar3 = StringStats::CheckZonemap
                      ((StringStats *)stats,
                       (BaseStatistics *)(ulong)(byte)(this->super_TableFilter).field_0x9,
                       comparison_type,constants_00);
  }
  if (FVar3 == FILTER_ALWAYS_TRUE) {
    bVar2 = BaseStatistics::CanHaveNull(stats);
    if (bVar2) {
      return NO_PRUNING_POSSIBLE;
    }
    return FILTER_ALWAYS_TRUE;
  }
  return FVar3;
}

Assistant:

FilterPropagateResult ConstantFilter::CheckStatistics(BaseStatistics &stats) {
	if (!stats.CanHaveNoNull()) {
		// no non-null values are possible: always false
		return FilterPropagateResult::FILTER_ALWAYS_FALSE;
	}
	FilterPropagateResult result;
	D_ASSERT(constant.type().id() == stats.GetType().id());
	switch (constant.type().InternalType()) {
	case PhysicalType::UINT8:
	case PhysicalType::UINT16:
	case PhysicalType::UINT32:
	case PhysicalType::UINT64:
	case PhysicalType::UINT128:
	case PhysicalType::INT8:
	case PhysicalType::INT16:
	case PhysicalType::INT32:
	case PhysicalType::INT64:
	case PhysicalType::INT128:
	case PhysicalType::FLOAT:
	case PhysicalType::DOUBLE:
		result = NumericStats::CheckZonemap(stats, comparison_type, array_ptr<Value>(&constant, 1));
		break;
	case PhysicalType::VARCHAR:
		result = StringStats::CheckZonemap(stats, comparison_type, array_ptr<Value>(&constant, 1));
		break;
	default:
		return FilterPropagateResult::NO_PRUNING_POSSIBLE;
	}
	if (result == FilterPropagateResult::FILTER_ALWAYS_TRUE) {
		// the numeric filter is always true, but the column can have NULL values
		// we can't prune the filter
		if (stats.CanHaveNull()) {
			return FilterPropagateResult::NO_PRUNING_POSSIBLE;
		}
	}
	return result;
}